

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

void __thiscall SpecificStrategy::matchBlocks(SpecificStrategy *this,Block *aBlocks,Block *bBlocks)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  iterator __position_00;
  _Self __tmp;
  _Self __tmp_1;
  
  __position_00._M_node = (bBlocks->perfect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0010c8f1:
  do {
    if ((_Rb_tree_header *)__position_00._M_node ==
        &(bBlocks->perfect)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    for (__position._M_node =
              (aBlocks->perfect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position._M_node !=
        &(aBlocks->perfect)._M_t._M_impl.super__Rb_tree_header;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
      p_Var1 = __position._M_node[1]._M_parent;
      p_Var2 = __position_00._M_node[1]._M_parent;
      if ((p_Var1 == p_Var2) &&
         (*(int *)&__position._M_node[1]._M_left == *(int *)&__position_00._M_node[1]._M_left)) {
LAB_0010c988:
        __position_00 =
             std::
             _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
             ::erase_abi_cxx11_((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                                 *)bBlocks,__position_00._M_node);
        goto LAB_0010c8f1;
      }
      if ((p_Var1 < (_Base_ptr)
                    ((long)&p_Var2->_M_color + (long)*(int *)&__position_00._M_node[1]._M_left)) &&
         (p_Var2 < (_Base_ptr)
                   ((long)&p_Var1->_M_color + (long)*(int *)&__position._M_node[1]._M_left))) {
        std::
        _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
        ::_M_insert_unique<CfgData::Node_const&>
                  ((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                    *)&aBlocks->conflict,(Node *)(__position._M_node + 1));
        std::
        _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
        ::erase_abi_cxx11_((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                            *)aBlocks,__position);
        std::
        _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
        ::_M_insert_unique<CfgData::Node_const&>
                  ((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                    *)&bBlocks->conflict,(Node *)(__position_00._M_node + 1));
        goto LAB_0010c988;
      }
    }
    __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
  } while( true );
}

Assistant:

void SpecificStrategy::matchBlocks(SpecificStrategy::Info::Block& aBlocks,
		SpecificStrategy::Info::Block& bBlocks) {
	for (std::set<CfgData::Node>::iterator bIT = bBlocks.perfect.begin(),
			bED = bBlocks.perfect.end(); bIT != bED; ) {
		bool next = true;
		for (std::set<CfgData::Node>::iterator aIT = aBlocks.perfect.begin(),
				aED = aBlocks.perfect.end(); aIT != aED; aIT++) {
			const CfgData::Node& aNode = *aIT;
			const CfgData::Node& bNode = *bIT;
			if (aNode == bNode) {
				bIT = bBlocks.perfect.erase(bIT);
				next = false;
				break;
			} else if (aNode.start < (bNode.start + bNode.size) &&
					   bNode.start < (aNode.start + aNode.size)) {
				aBlocks.conflict.insert(aNode);
				aBlocks.perfect.erase(aIT);

				bBlocks.conflict.insert(bNode);
				bIT = bBlocks.perfect.erase(bIT);

				next = false;
				break;
			}
		}

		if (next)
			bIT++;
	}
}